

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_CustomOptionConflictingFieldNumber_Test::
TestBody(ValidationErrorTest_CustomOptionConflictingFieldNumber_Test *this)

{
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_CustomOptionConflictingFieldNumber_Test *local_10;
  ValidationErrorTest_CustomOptionConflictingFieldNumber_Test *this_local;
  
  local_10 = this;
  ValidationErrorTest::BuildDescriptorMessagesInTestPool(&this->super_ValidationErrorTest);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" extension { name: \"foo1\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FieldOptions\" }extension { name: \"foo2\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_INT32 extendee: \"google.protobuf.FieldOptions\" }"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,
            "foo.proto: foo2: NUMBER: Extension number 7672757 has already been used in \"google.protobuf.FieldOptions\" by extension \"foo1\".\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, CustomOptionConflictingFieldNumber) {
  BuildDescriptorMessagesInTestPool();

  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { name: \"foo1\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FieldOptions\" }"
      "extension { name: \"foo2\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_INT32 extendee: \"google.protobuf.FieldOptions\" }",

      "foo.proto: foo2: NUMBER: Extension number 7672757 has already been used "
      "in \"google.protobuf.FieldOptions\" by extension \"foo1\".\n");
}